

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

int deMemPool_getNumAllocatedBytes(deMemPool *pool,deBool recurse)

{
  MemPage *pMVar1;
  deMemPool *pool_00;
  int iVar2;
  MemPage **ppMVar3;
  int iVar4;
  deMemPool **ppdVar5;
  
  iVar4 = 0;
  ppMVar3 = &pool->currentPage;
  while (pMVar1 = *ppMVar3, pMVar1 != (MemPage *)0x0) {
    iVar4 = iVar4 + pMVar1->bytesAllocated;
    ppMVar3 = &pMVar1->nextPage;
  }
  if (recurse != 0) {
    ppdVar5 = &pool->firstChild;
    while (pool_00 = *ppdVar5, pool_00 != (deMemPool *)0x0) {
      iVar2 = deMemPool_getNumAllocatedBytes(pool_00,1);
      iVar4 = iVar4 + iVar2;
      ppdVar5 = &pool_00->nextPool;
    }
  }
  return iVar4;
}

Assistant:

int deMemPool_getNumAllocatedBytes (const deMemPool* pool, deBool recurse)
{
	int			numAllocatedBytes = 0;
	MemPage*	memPage;

	for (memPage = pool->currentPage; memPage; memPage = memPage->nextPage)
		numAllocatedBytes += memPage->bytesAllocated;

	if (recurse)
	{
		deMemPool* child;
		for (child = pool->firstChild; child; child = child->nextPool)
			numAllocatedBytes += deMemPool_getNumAllocatedBytes(child, DE_TRUE);
	}

	return numAllocatedBytes;
}